

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall BenevolentBotStrategy::place(BenevolentBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  iterator __begin2;
  pointer ppCVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  pointer ppCVar7;
  double dVar8;
  
  if (*(this->super_PlayerStrategy).numWeakest == -1) {
    pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    ppCVar3 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    iVar6 = 0;
    iVar5 = 0;
    if (ppCVar3 != ppCVar2) {
      iVar5 = 0;
      ppCVar7 = ppCVar3;
      do {
        if ((iVar5 == 0) || (*(*ppCVar7)->pNumberOfTroops < iVar5)) {
          iVar5 = *(*ppCVar7)->pNumberOfTroops;
        }
        ppCVar7 = ppCVar7 + 1;
      } while (ppCVar7 != ppCVar2);
    }
    if (ppCVar3 != ppCVar2) {
      iVar6 = 0;
      do {
        iVar6 = iVar6 + (uint)(*(*ppCVar3)->pNumberOfTroops == iVar5);
        ppCVar3 = ppCVar3 + 1;
      } while (ppCVar3 != ppCVar2);
    }
    piVar4 = (int *)operator_new(4);
    *piVar4 = iVar6;
    (this->super_PlayerStrategy).numWeakest = piVar4;
  }
  dVar8 = ceil((double)*(this->super_PlayerStrategy).armiesToPlace /
               (double)*(this->super_PlayerStrategy).numWeakest);
  return (int)dVar8;
}

Assistant:

int BenevolentBotStrategy::place() {
    if (*numWeakest == -1) {
        int count = 0;
        int weakest = 0;
        for (auto* country : *player->getOwnedCountries()) {
            if (weakest == 0 || country->getNumberOfTroops() < weakest) {
                weakest = country->getNumberOfTroops();
            }
        }

        // Then find out how many other countries have the same number of armies as it
        for (auto* country : *player->getOwnedCountries()) {
            if (country->getNumberOfTroops() == weakest) {
                count++;
            }
        }

        numWeakest = new int(count);
    }
    return ceil((double)*armiesToPlace / (double)*numWeakest);
}